

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

double zernike_poly(int m,int n,double rho)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double zp2;
  double zm2;
  double z;
  int nn;
  double d;
  double c;
  double b;
  double a;
  double rho_local;
  int n_local;
  int m_local;
  
  if (m < 0) {
    _n_local = 0.0;
  }
  else if (n < 0) {
    _n_local = 0.0;
  }
  else if (n < m) {
    _n_local = 0.0;
  }
  else if ((n - m) % 2 == 1) {
    _n_local = 0.0;
  }
  else {
    zp2 = 0.0;
    zm2 = pow(rho,(double)m);
    z._4_4_ = m;
    if (m == 0) {
      if (n == 0) {
        return zm2;
      }
      zp2 = zm2;
      zm2 = rho * 2.0 * rho + -1.0;
      for (z._4_4_ = 2; z._4_4_ <= n + -2; z._4_4_ = z._4_4_ + 2) {
        iVar1 = z._4_4_ + 2;
        iVar2 = z._4_4_ + 2;
        iVar7 = z._4_4_ + 2;
        iVar3 = z._4_4_ + 1;
        iVar4 = z._4_4_ * z._4_4_;
        dVar10 = (double)z._4_4_;
        iVar5 = z._4_4_ + 2;
        iVar8 = z._4_4_ + 2;
        iVar6 = z._4_4_ + 2;
        dVar11 = ((double)(z._4_4_ * z._4_4_) / (double)z._4_4_) * zp2;
        zp2 = zm2;
        zm2 = ((double)iVar1 / (double)(iVar2 * iVar7)) *
              (((double)(iVar3 * 4) * rho * rho +
               -((double)iVar4 / dVar10 + (double)(iVar5 * iVar8) / (double)iVar6)) * zm2 + -dVar11)
        ;
      }
    }
    else {
      for (; z._4_4_ <= n + -2; z._4_4_ = z._4_4_ + 2) {
        iVar1 = z._4_4_ + 2;
        iVar2 = z._4_4_ + 2;
        iVar7 = z._4_4_ + 2;
        iVar3 = z._4_4_ + 1;
        iVar4 = z._4_4_ + m;
        iVar8 = z._4_4_ + m;
        dVar10 = (double)z._4_4_;
        iVar5 = z._4_4_ - m;
        iVar9 = z._4_4_ - m;
        iVar6 = z._4_4_ + 2;
        dVar11 = ((double)(z._4_4_ * z._4_4_ - m * m) / (double)z._4_4_) * zp2;
        zp2 = zm2;
        zm2 = ((double)iVar1 / (double)(iVar2 * iVar7 - m * m)) *
              (((double)(iVar3 * 4) * rho * rho +
               -((double)(iVar4 * iVar8) / dVar10 +
                (double)((iVar5 + 2) * (iVar9 + 2)) / (double)iVar6)) * zm2 + -dVar11);
      }
    }
    _n_local = zm2;
  }
  return _n_local;
}

Assistant:

BURKHARDT_EXPORT
double zernike_poly ( int m, int n, double rho )

//****************************************************************************80
//
//  Purpose:
//
//    ZERNIKE_POLY evaluates a Zernike polynomial at RHO.
//
//  Discussion:
//
//    This routine uses the facts that:
//
//    *) R^M_N = 0 if M < 0, or N < 0, or N < M.
//    *) R^M_M = RHO^M
//    *) R^M_N = 0 if mod ( N - M, 2 ) = 1.
//
//    and the recursion:
//
//    R^M_(N+2) = A * [ ( B * RHO^2 - C ) * R^M_N - D * R^M_(N-2) ]
//
//    where
//
//    A = ( N + 2 ) / ( ( N + 2 )^2 - M^2 )
//    B = 4 * ( N + 1 )
//    C = ( N + M )^2 / N + ( N - M + 2 )^2 / ( N + 2 )
//    D = ( N^2 - M^2 ) / N
//
//    I wish I could clean up the recursion in the code, but for
//    now, I have to treat the case M = 0 specially.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    11 November 2005
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Eric Weisstein,
//    CRC Concise Encyclopedia of Mathematics,
//    CRC Press, 2002,
//    Second edition,
//    ISBN: 1584883472,
//    LC: QA5.W45.
//
//  Parameters:
//
//    Input, int M, the upper index.
//
//    Input, int N, the lower index.
//
//    Input, double RHO, the radial coordinate.
//
//    Output, double ZERNIKE_POLY, the value of the Zernike
//    polynomial R^M_N at the point RHO.
//
{
  double a;
  double b;
  double c;
  double d;
  int nn;
  double z;
  double zm2;
  double zp2;
//
//  Do checks.
//
  if ( m < 0 )
  {
    z = 0.0;
    return z;
  }

  if ( n < 0 )
  {
    z = 0.0;
    return z;
  }

  if ( n < m )
  {
    z = 0.0;
    return z;
  }

  if ( ( n - m ) % 2 == 1 )
  {
    z = 0.0;
    return z;
  }

  zm2 = 0.0;
  z = pow ( rho, m );

  if ( m == 0 )
  {
    if ( n == 0 )
    {
      return z;
    }

    zm2 = z;
    z = 2.0 * rho * rho - 1.0;

    for ( nn = m+2; nn <= n-2; nn = nn + 2 )
    {
      a = double( nn + 2 ) 
        / double( ( nn + 2 ) * ( nn + 2 ) - m * m );

      b = double( 4 * ( nn + 1 ) );

      c = double( ( nn + m ) * ( nn + m ) ) / double( nn ) 
        + double( ( nn - m + 2 ) * ( nn - m + 2 ) ) 
        / double( nn + 2 );

      d = double( nn * nn - m * m ) / double( nn );

      zp2 = a * ( ( b * rho * rho - c ) * z - d * zm2 );
      zm2 = z;
      z = zp2;
    }
  }
  else
  {
    for ( nn = m; nn <= n-2; nn = nn + 2 )
    {
      a = double( nn + 2 ) 
        / double( ( nn + 2 ) * ( nn + 2 ) - m * m );

      b = double( 4 * ( nn + 1 ) );

      c = double( ( nn + m ) * ( nn + m ) ) / double( nn ) 
        + double( ( nn - m + 2 ) * ( nn - m + 2 ) ) 
        / double( nn + 2 );

      d = double( nn * nn - m * m ) / double( nn );

      zp2 = a * ( ( b * rho * rho - c ) * z - d * zm2 );
      zm2 = z;
      z = zp2;
    }
  }

  return z;
}